

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.cpp
# Opt level: O2

void DoBlending_SSE2(PalEntry *from,PalEntry *to,int count,int r,int g,int b,int a)

{
  char *pcVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [15];
  undefined1 auVar20 [11];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  long lVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  short sVar35;
  undefined1 auVar34 [16];
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  ushort uVar40;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  undefined1 auVar41 [16];
  ushort uVar48;
  ushort uVar49;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  ushort uVar59;
  undefined1 auVar52 [16];
  short sVar31;
  short sVar32;
  short sVar33;
  
  uVar29 = (long)b | (ulong)(uint)r << 0x20 | (long)(g << 0x10);
  uVar26 = a << 0x10 | a;
  uVar27 = (long)(int)uVar26 | (ulong)(uint)a << 0x20;
  auVar34._8_4_ = uVar26;
  auVar34._0_8_ = uVar27;
  auVar34._12_4_ = (int)(uVar27 >> 0x20);
  auVar30._0_2_ = (short)b * (short)a;
  sVar31 = (short)(uVar29 >> 0x10);
  sVar37 = (short)(uVar26 >> 0x10);
  auVar30._2_2_ = sVar31 * sVar37;
  sVar32 = (short)(uVar29 >> 0x20);
  sVar38 = (short)(uVar27 >> 0x20);
  auVar30._4_2_ = sVar32 * sVar38;
  sVar33 = (short)(uVar29 >> 0x30);
  sVar39 = (short)(uVar27 >> 0x30);
  auVar30._6_2_ = sVar33 * sVar39;
  auVar30._8_2_ = (short)b * (short)a;
  auVar30._10_2_ = sVar31 * sVar37;
  auVar30._12_2_ = sVar32 * sVar38;
  auVar30._14_2_ = sVar33 * sVar39;
  auVar34 = psubusw(_DAT_00602d30,auVar34);
  iVar28 = count >> 2;
  sVar31 = auVar34._0_2_;
  sVar32 = auVar34._2_2_;
  sVar33 = auVar34._4_2_;
  sVar37 = auVar34._6_2_;
  sVar38 = auVar34._8_2_;
  sVar39 = auVar34._10_2_;
  sVar35 = auVar34._12_2_;
  sVar36 = auVar34._14_2_;
  if ((((uint)to | (uint)from) & 0xf) == 0) {
    lVar25 = 0;
    for (; 0 < iVar28; iVar28 = iVar28 + -1) {
      auVar34 = *(undefined1 (*) [16])((long)&from->field_0 + lVar25);
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar34._0_13_;
      auVar3[0xe] = auVar34[7];
      auVar5[0xc] = auVar34[6];
      auVar5._0_12_ = auVar34._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar34._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9[10] = auVar34[5];
      auVar9._0_10_ = auVar34._0_10_;
      auVar9._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar34._0_9_;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = auVar34[4];
      auVar13._0_8_ = auVar34._0_8_;
      auVar13._9_6_ = auVar11._9_6_;
      auVar19._7_8_ = 0;
      auVar19._0_7_ = auVar13._8_7_;
      Var17 = CONCAT81(SUB158(auVar19 << 0x40,7),auVar34[3]);
      auVar23._9_6_ = 0;
      auVar23._0_9_ = Var17;
      auVar20._1_10_ = SUB1510(auVar23 << 0x30,5);
      auVar20[0] = auVar34[2];
      auVar24._11_4_ = 0;
      auVar24._0_11_ = auVar20;
      auVar15[2] = auVar34[1];
      auVar15._0_2_ = auVar34._0_2_;
      auVar15._3_12_ = SUB1512(auVar24 << 0x20,3);
      auVar51._0_2_ = (auVar34._0_2_ & 0xff) * sVar31;
      auVar51._2_2_ = auVar15._2_2_ * sVar32;
      auVar51._4_2_ = auVar20._0_2_ * sVar33;
      auVar51._6_2_ = (short)Var17 * sVar37;
      auVar51._8_2_ = auVar13._8_2_ * sVar38;
      auVar51._10_2_ = auVar9._10_2_ * sVar39;
      auVar51._12_2_ = auVar5._12_2_ * sVar35;
      auVar51._14_2_ = (auVar3._13_2_ >> 8) * sVar36;
      auVar52._0_2_ = (ushort)auVar34[8] * sVar31;
      auVar52._2_2_ = (ushort)auVar34[9] * sVar32;
      auVar52._4_2_ = (ushort)auVar34[10] * sVar33;
      auVar52._6_2_ = (ushort)auVar34[0xb] * sVar37;
      auVar52._8_2_ = (ushort)auVar34[0xc] * sVar38;
      auVar52._10_2_ = (ushort)auVar34[0xd] * sVar39;
      auVar52._12_2_ = (ushort)auVar34[0xe] * sVar35;
      auVar52._14_2_ = (ushort)auVar34[0xf] * sVar36;
      auVar34 = paddusw(auVar51,auVar30);
      auVar51 = paddusw(auVar52,auVar30);
      uVar40 = auVar34._0_2_ >> 8;
      uVar42 = auVar34._2_2_ >> 8;
      uVar43 = auVar34._4_2_ >> 8;
      uVar44 = auVar34._6_2_ >> 8;
      uVar45 = auVar34._8_2_ >> 8;
      uVar46 = auVar34._10_2_ >> 8;
      uVar47 = auVar34._12_2_ >> 8;
      uVar48 = auVar34._14_2_ >> 8;
      uVar49 = auVar51._0_2_ >> 8;
      uVar53 = auVar51._2_2_ >> 8;
      uVar54 = auVar51._4_2_ >> 8;
      uVar55 = auVar51._6_2_ >> 8;
      uVar56 = auVar51._8_2_ >> 8;
      uVar57 = auVar51._10_2_ >> 8;
      uVar58 = auVar51._12_2_ >> 8;
      uVar59 = auVar51._14_2_ >> 8;
      pcVar1 = (char *)((long)&to->field_0 + lVar25);
      *pcVar1 = (uVar40 != 0) * (uVar40 < 0x100) * auVar34[1] - (0xff < uVar40);
      pcVar1[1] = (uVar42 != 0) * (uVar42 < 0x100) * auVar34[3] - (0xff < uVar42);
      pcVar1[2] = (uVar43 != 0) * (uVar43 < 0x100) * auVar34[5] - (0xff < uVar43);
      pcVar1[3] = (uVar44 != 0) * (uVar44 < 0x100) * auVar34[7] - (0xff < uVar44);
      pcVar1[4] = (uVar45 != 0) * (uVar45 < 0x100) * auVar34[9] - (0xff < uVar45);
      pcVar1[5] = (uVar46 != 0) * (uVar46 < 0x100) * auVar34[0xb] - (0xff < uVar46);
      pcVar1[6] = (uVar47 != 0) * (uVar47 < 0x100) * auVar34[0xd] - (0xff < uVar47);
      pcVar1[7] = (uVar48 != 0) * (uVar48 < 0x100) * auVar34[0xf] - (0xff < uVar48);
      pcVar1[8] = (uVar49 != 0) * (uVar49 < 0x100) * auVar51[1] - (0xff < uVar49);
      pcVar1[9] = (uVar53 != 0) * (uVar53 < 0x100) * auVar51[3] - (0xff < uVar53);
      pcVar1[10] = (uVar54 != 0) * (uVar54 < 0x100) * auVar51[5] - (0xff < uVar54);
      pcVar1[0xb] = (uVar55 != 0) * (uVar55 < 0x100) * auVar51[7] - (0xff < uVar55);
      pcVar1[0xc] = (uVar56 != 0) * (uVar56 < 0x100) * auVar51[9] - (0xff < uVar56);
      pcVar1[0xd] = (uVar57 != 0) * (uVar57 < 0x100) * auVar51[0xb] - (0xff < uVar57);
      pcVar1[0xe] = (uVar58 != 0) * (uVar58 < 0x100) * auVar51[0xd] - (0xff < uVar58);
      pcVar1[0xf] = (uVar59 != 0) * (uVar59 < 0x100) * auVar51[0xf] - (0xff < uVar59);
      lVar25 = lVar25 + 0x10;
    }
  }
  else {
    lVar25 = 0;
    for (; 0 < iVar28; iVar28 = iVar28 + -1) {
      auVar34 = *(undefined1 (*) [16])((long)&from->field_0 + lVar25);
      auVar2[0xd] = 0;
      auVar2._0_13_ = auVar34._0_13_;
      auVar2[0xe] = auVar34[7];
      auVar4[0xc] = auVar34[6];
      auVar4._0_12_ = auVar34._0_12_;
      auVar4._13_2_ = auVar2._13_2_;
      auVar6[0xb] = 0;
      auVar6._0_11_ = auVar34._0_11_;
      auVar6._12_3_ = auVar4._12_3_;
      auVar8[10] = auVar34[5];
      auVar8._0_10_ = auVar34._0_10_;
      auVar8._11_4_ = auVar6._11_4_;
      auVar10[9] = 0;
      auVar10._0_9_ = auVar34._0_9_;
      auVar10._10_5_ = auVar8._10_5_;
      auVar12[8] = auVar34[4];
      auVar12._0_8_ = auVar34._0_8_;
      auVar12._9_6_ = auVar10._9_6_;
      auVar16._7_8_ = 0;
      auVar16._0_7_ = auVar12._8_7_;
      Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),auVar34[3]);
      auVar21._9_6_ = 0;
      auVar21._0_9_ = Var17;
      auVar18._1_10_ = SUB1510(auVar21 << 0x30,5);
      auVar18[0] = auVar34[2];
      auVar22._11_4_ = 0;
      auVar22._0_11_ = auVar18;
      auVar14[2] = auVar34[1];
      auVar14._0_2_ = auVar34._0_2_;
      auVar14._3_12_ = SUB1512(auVar22 << 0x20,3);
      auVar41._0_2_ = (auVar34._0_2_ & 0xff) * sVar31;
      auVar41._2_2_ = auVar14._2_2_ * sVar32;
      auVar41._4_2_ = auVar18._0_2_ * sVar33;
      auVar41._6_2_ = (short)Var17 * sVar37;
      auVar41._8_2_ = auVar12._8_2_ * sVar38;
      auVar41._10_2_ = auVar8._10_2_ * sVar39;
      auVar41._12_2_ = auVar4._12_2_ * sVar35;
      auVar41._14_2_ = (auVar2._13_2_ >> 8) * sVar36;
      auVar50._0_2_ = (ushort)auVar34[8] * sVar31;
      auVar50._2_2_ = (ushort)auVar34[9] * sVar32;
      auVar50._4_2_ = (ushort)auVar34[10] * sVar33;
      auVar50._6_2_ = (ushort)auVar34[0xb] * sVar37;
      auVar50._8_2_ = (ushort)auVar34[0xc] * sVar38;
      auVar50._10_2_ = (ushort)auVar34[0xd] * sVar39;
      auVar50._12_2_ = (ushort)auVar34[0xe] * sVar35;
      auVar50._14_2_ = (ushort)auVar34[0xf] * sVar36;
      auVar34 = paddusw(auVar41,auVar30);
      auVar51 = paddusw(auVar50,auVar30);
      uVar40 = auVar34._0_2_ >> 8;
      uVar42 = auVar34._2_2_ >> 8;
      uVar43 = auVar34._4_2_ >> 8;
      uVar44 = auVar34._6_2_ >> 8;
      uVar45 = auVar34._8_2_ >> 8;
      uVar46 = auVar34._10_2_ >> 8;
      uVar47 = auVar34._12_2_ >> 8;
      uVar48 = auVar34._14_2_ >> 8;
      uVar49 = auVar51._0_2_ >> 8;
      uVar53 = auVar51._2_2_ >> 8;
      uVar54 = auVar51._4_2_ >> 8;
      uVar55 = auVar51._6_2_ >> 8;
      uVar56 = auVar51._8_2_ >> 8;
      uVar57 = auVar51._10_2_ >> 8;
      uVar58 = auVar51._12_2_ >> 8;
      uVar59 = auVar51._14_2_ >> 8;
      pcVar1 = (char *)((long)&to->field_0 + lVar25);
      *pcVar1 = (uVar40 != 0) * (uVar40 < 0x100) * auVar34[1] - (0xff < uVar40);
      pcVar1[1] = (uVar42 != 0) * (uVar42 < 0x100) * auVar34[3] - (0xff < uVar42);
      pcVar1[2] = (uVar43 != 0) * (uVar43 < 0x100) * auVar34[5] - (0xff < uVar43);
      pcVar1[3] = (uVar44 != 0) * (uVar44 < 0x100) * auVar34[7] - (0xff < uVar44);
      pcVar1[4] = (uVar45 != 0) * (uVar45 < 0x100) * auVar34[9] - (0xff < uVar45);
      pcVar1[5] = (uVar46 != 0) * (uVar46 < 0x100) * auVar34[0xb] - (0xff < uVar46);
      pcVar1[6] = (uVar47 != 0) * (uVar47 < 0x100) * auVar34[0xd] - (0xff < uVar47);
      pcVar1[7] = (uVar48 != 0) * (uVar48 < 0x100) * auVar34[0xf] - (0xff < uVar48);
      pcVar1[8] = (uVar49 != 0) * (uVar49 < 0x100) * auVar51[1] - (0xff < uVar49);
      pcVar1[9] = (uVar53 != 0) * (uVar53 < 0x100) * auVar51[3] - (0xff < uVar53);
      pcVar1[10] = (uVar54 != 0) * (uVar54 < 0x100) * auVar51[5] - (0xff < uVar54);
      pcVar1[0xb] = (uVar55 != 0) * (uVar55 < 0x100) * auVar51[7] - (0xff < uVar55);
      pcVar1[0xc] = (uVar56 != 0) * (uVar56 < 0x100) * auVar51[9] - (0xff < uVar56);
      pcVar1[0xd] = (uVar57 != 0) * (uVar57 < 0x100) * auVar51[0xb] - (0xff < uVar57);
      pcVar1[0xe] = (uVar58 != 0) * (uVar58 < 0x100) * auVar51[0xd] - (0xff < uVar58);
      pcVar1[0xf] = (uVar59 != 0) * (uVar59 < 0x100) * auVar51[0xf] - (0xff < uVar59);
      lVar25 = lVar25 + 0x10;
    }
  }
  return;
}

Assistant:

void DoBlending_SSE2(const PalEntry *from, PalEntry *to, int count, int r, int g, int b, int a)
{
	__m128i blendcolor;
	__m128i blendalpha;
	__m128i zero;
	__m128i blending256;
	__m128i color1;
	__m128i color2;
	size_t unaligned;

	unaligned = ((size_t)from | (size_t)to) & 0xF;

#if defined(__amd64__) || defined(_M_X64)
	long long color;

	blending256 = _mm_set_epi64x(0x10001000100ll, 0x10001000100ll);

	color = ((long long)r << 32) | (g << 16) | b;
	blendcolor = _mm_set_epi64x(color, color);

	color = ((long long)a << 32) | (a << 16) | a;
	blendalpha = _mm_set_epi64x(color, color);
#else
	int color;

	blending256 = _mm_set_epi32(0x100, 0x1000100, 0x100, 0x1000100);

	color = (g << 16) | b;
	blendcolor = _mm_set_epi32(r, color, r, color);

	color = (a << 16) | a;
	blendalpha = _mm_set_epi32(a, color, a, color);
#endif

	blendcolor = _mm_mullo_epi16(blendcolor, blendalpha);	// premultiply blend by alpha
	blendalpha = _mm_subs_epu16(blending256, blendalpha);	// one minus alpha

	zero = _mm_setzero_si128();

	if (unaligned)
	{
		for (count >>= 2; count > 0; --count)
		{
			color1 = _mm_loadu_si128((__m128i *)from);
			from += 4;
			color2 = _mm_unpackhi_epi8(color1, zero);
			color1 = _mm_unpacklo_epi8(color1, zero);
			color1 = _mm_mullo_epi16(blendalpha, color1);
			color2 = _mm_mullo_epi16(blendalpha, color2);
			color1 = _mm_adds_epu16(blendcolor, color1);
			color2 = _mm_adds_epu16(blendcolor, color2);
			color1 = _mm_srli_epi16(color1, 8);
			color2 = _mm_srli_epi16(color2, 8);
			_mm_storeu_si128((__m128i *)to, _mm_packus_epi16(color1, color2));
			to += 4;
		}
	}
	else
	{
		for (count >>= 2; count > 0; --count)
		{
			color1 = _mm_load_si128((__m128i *)from);
			from += 4;
			color2 = _mm_unpackhi_epi8(color1, zero);
			color1 = _mm_unpacklo_epi8(color1, zero);
			color1 = _mm_mullo_epi16(blendalpha, color1);
			color2 = _mm_mullo_epi16(blendalpha, color2);
			color1 = _mm_adds_epu16(blendcolor, color1);
			color2 = _mm_adds_epu16(blendcolor, color2);
			color1 = _mm_srli_epi16(color1, 8);
			color2 = _mm_srli_epi16(color2, 8);
			_mm_store_si128((__m128i *)to, _mm_packus_epi16(color1, color2));
			to += 4;
		}
	}
}